

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::NewKey
          (TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_> *this,
          FName *key)

{
  bool bVar1;
  Node *pNVar2;
  FName local_48;
  FName local_44;
  Node *local_40;
  Node *n;
  Node *othern;
  Node *local_28;
  Node *mp;
  FName *key_local;
  TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_> *this_local;
  
  mp = (Node *)key;
  key_local = (FName *)this;
  FName::FName((FName *)((long)&othern + 4),key);
  local_28 = MainPosition(this,(FName *)((long)&othern + 4));
  bVar1 = Node::IsNil(local_28);
  if (bVar1) {
    local_28->Next = (Node *)0x0;
  }
  else {
    local_40 = GetFreePos(this);
    if (local_40 == (Node *)0x0) {
      Rehash(this);
      FName::FName(&local_44,key);
      pNVar2 = NewKey(this,&local_44);
      return pNVar2;
    }
    FName::FName(&local_48,&(local_28->Pair).Key);
    n = MainPosition(this,&local_48);
    if (n == local_28) {
      local_40->Next = local_28->Next;
      local_28->Next = local_40;
      local_28 = local_40;
    }
    else {
      for (; n->Next != local_28; n = n->Next) {
      }
      n->Next = local_40;
      CopyNode(this,local_40,local_28);
      local_28->Next = (Node *)0x0;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  FName::FName(&(local_28->Pair).Key,key);
  return local_28;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}